

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4::ChElementTetraCorot_4(ChElementTetraCorot_4 *this)

{
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  undefined1 auVar1 [64];
  assign_op<double,_double> local_49;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_48;
  
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron = (_func_int **)0xb33ec8;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb33fc8;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb34088;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb34118;
  this->Volume = 0.0;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                 )auVar1._0_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumElastic>)auVar1._24_16_;
  this->MatrB = (ChMatrixDynamic<>)auVar1._40_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumElastic>)auVar1._0_16_;
  this->MatrB = (ChMatrixDynamic<>)auVar1._16_24_;
  this->StiffnessMatrix = (ChMatrixDynamic<>)auVar1._40_24_;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->nodes,4);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->MatrB,0x48,6,0xc);
  local_48.m_rows.m_value =
       (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_rows;
  local_48.m_cols.m_value =
       (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_cols;
  local_48.m_functor.m_other = 0.0;
  if (-1 < (local_48.m_cols.m_value | local_48.m_rows.m_value)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->MatrB,&local_48,&local_49);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&this->StiffnessMatrix,0x90,0xc,0xc);
    local_48.m_rows.m_value =
         (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_rows;
    local_48.m_cols.m_value =
         (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_cols;
    local_48.m_functor.m_other = 0.0;
    if (-1 < (local_48.m_cols.m_value | local_48.m_rows.m_value)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                (&this->StiffnessMatrix,&local_48,&local_49);
      return;
    }
  }
  local_48.m_functor.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementTetraCorot_4::ChElementTetraCorot_4() : Volume(0) {
    nodes.resize(4);
    this->MatrB.setZero(6, 12);
    this->StiffnessMatrix.setZero(12, 12);
}